

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

void mp_next(char **data)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  long lVar4;
  long k;
  
  k = 1;
  do {
    pbVar2 = (byte *)*data;
    bVar1 = *pbVar2;
    *data = (char *)(pbVar2 + 1);
    lVar4 = (long)""[bVar1];
    if (lVar4 < 0) {
      if (bVar1 == 0xd9) {
        *data = (char *)(pbVar2 + (ulong)pbVar2[1] + 2);
        goto LAB_00134b96;
      }
      if (-0x20 < ""[bVar1]) {
        k = k - lVar4;
        goto LAB_00134b96;
      }
      *data = (char *)pbVar2;
      mp_next_slowpath(data,k);
      bVar3 = false;
      lVar4 = k;
    }
    else {
      *data = (char *)(pbVar2 + 1 + lVar4);
LAB_00134b96:
      bVar3 = true;
      lVar4 = k;
    }
    if ((!bVar3) || (k = lVar4 + -1, lVar4 < 2)) {
      return;
    }
  } while( true );
}

Assistant:

MP_IMPL void
mp_next(const char **data)
{
	int64_t k = 1;
	for (; k > 0; k--) {
		uint8_t c = mp_load_u8(data);
		int l = mp_parser_hint[c];
		if (mp_likely(l >= 0)) {
			*data += l;
			continue;
		} else if (mp_likely(c == 0xd9)){
			/* MP_STR (8) */
			uint8_t len = mp_load_u8(data);
			*data += len;
			continue;
		} else if (l > MP_HINT) {
			k -= l;
			continue;
		} else {
			*data -= sizeof(uint8_t);
			mp_next_slowpath(data, k);
			return;
		}
	}
}